

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::mapped_string::~mapped_string(mapped_string *this)

{
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

~mapped_string() = default;